

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMidiBuffer.cpp
# Opt level: O0

bool __thiscall QMidiBuffer::requestSpace(QMidiBuffer *this,quint32 eventLength)

{
  void *pvVar1;
  MidiEventHeader *padHeader;
  quint32 eventLength_local;
  QMidiBuffer *this_local;
  
  if (this->writePointer == (void *)0x0) {
    pvVar1 = Utility::QRingBuffer::writePointer
                       (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
    this->writePointer = pvVar1;
  }
  while( true ) {
    if ((ulong)eventLength + 4 <= (ulong)this->bytesToWrite) {
      return true;
    }
    if ((this->freeSpaceContiguous & 1U) != 0) break;
    *(undefined4 *)this->writePointer = 2;
    this->bytesWritten = this->bytesToWrite + this->bytesWritten;
    flush(this);
    pvVar1 = Utility::QRingBuffer::writePointer
                       (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
    this->writePointer = pvVar1;
  }
  return eventLength <= this->bytesToWrite;
}

Assistant:

bool QMidiBuffer::requestSpace(quint32 eventLength) {
	if (writePointer == NULL) {
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	while (bytesToWrite < (eventLength + sizeof(MidiEventHeader))) {
		if (freeSpaceContiguous) return eventLength <= bytesToWrite;
		// When the free space isn't contiguous, pad the rest of the ring buffer
		// and restart from the beginning.
		MidiEventHeader *padHeader = static_cast<MidiEventHeader *>(writePointer);
		padHeader->eventType = MidiEventLayout::MidiEventType_PAD;
		bytesWritten += bytesToWrite;
		flush();
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	return true;
}